

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  IRContext *this_00;
  Analysis preserved_analyses;
  Loop *pLVar1;
  BasicBlock *insert_point;
  Loop *loop_local;
  LoopUnrollerUtilsImpl *this_local;
  
  Unroll(this,loop,this->number_of_loop_iterations_);
  FoldConditionBlock(this,this->loop_condition_block_,1);
  CloseUnrolledLoop(this,loop);
  Loop::MarkLoopForRemoval(loop);
  pLVar1 = Loop::GetParent(loop);
  if (pLVar1 != (Loop *)0x0) {
    pLVar1 = Loop::GetParent(loop);
    AddBlocksToLoop(this,pLVar1);
  }
  insert_point = Loop::GetMergeBlock(loop);
  AddBlocksToFunction(this,insert_point);
  ReplaceInductionUseWithFinalValue(this,loop);
  RemoveDeadInstructions(this);
  this_00 = this->context_;
  preserved_analyses = operator|(kAnalysisLoopAnalysis,kAnalysisBegin);
  IRContext::InvalidateAnalysesExceptFor(this_00,preserved_analyses);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::FullyUnroll(Loop* loop) {
  // We unroll the loop by number of iterations in the loop.
  Unroll(loop, number_of_loop_iterations_);

  // The first condition block is preserved until now so it can be copied.
  FoldConditionBlock(loop_condition_block_, 1);

  // Delete the OpLoopMerge and remove the backedge to the header.
  CloseUnrolledLoop(loop);

  // Mark the loop for later deletion. This allows us to preserve the loop
  // iterators but still disregard dead loops.
  loop->MarkLoopForRemoval();

  // If the loop has a parent add the new blocks to the parent.
  if (loop->GetParent()) {
    AddBlocksToLoop(loop->GetParent());
  }

  // Add the blocks to the function.
  AddBlocksToFunction(loop->GetMergeBlock());

  ReplaceInductionUseWithFinalValue(loop);

  RemoveDeadInstructions();
  // Invalidate all analyses.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse);
}